

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlParserInputPtr resolveEntitySplit(void *ctx,xmlChar *publicId,xmlChar *systemId)

{
  code *UNRECOVERED_JUMPTABLE;
  xmlParserInputPtr pxVar1;
  xmlSchemaSAXPlugPtr ctxt;
  
  if (((ctx != (void *)0x0) && (*(long *)((long)ctx + 0x10) != 0)) &&
     (UNRECOVERED_JUMPTABLE = *(code **)(*(long *)((long)ctx + 0x10) + 0x20),
     UNRECOVERED_JUMPTABLE != (code *)0x0)) {
    pxVar1 = (xmlParserInputPtr)(*UNRECOVERED_JUMPTABLE)(*(undefined8 *)((long)ctx + 0x20));
    return pxVar1;
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

static xmlParserInputPtr
resolveEntitySplit(void *ctx, const xmlChar *publicId, const xmlChar *systemId)
{
    xmlSchemaSAXPlugPtr ctxt = (xmlSchemaSAXPlugPtr) ctx;
    if ((ctxt != NULL) && (ctxt->user_sax != NULL) &&
        (ctxt->user_sax->resolveEntity != NULL))
	return(ctxt->user_sax->resolveEntity(ctxt->user_data, publicId,
	                                     systemId));
    return(NULL);
}